

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

void * adt_ary_pop(adt_ary_t *self)

{
  int iVar1;
  void *pElem;
  adt_ary_t *self_local;
  
  if (self == (adt_ary_t *)0x0) {
    __assert_fail("(self!=0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                  ,0xc9,"void *adt_ary_pop(adt_ary_t *)");
  }
  if (self->s32CurLen == 0) {
    self_local = (adt_ary_t *)0x0;
  }
  else {
    iVar1 = self->s32CurLen + -1;
    self->s32CurLen = iVar1;
    self_local = (adt_ary_t *)self->pFirst[iVar1];
    if (self->s32CurLen == 0) {
      self->pFirst = self->ppAlloc;
    }
  }
  return self_local;
}

Assistant:

void*	adt_ary_pop(adt_ary_t *self){
	void *pElem;
	assert( (self!=0) );
	if(self->s32CurLen==0){
		return (void*) 0;
	}
	pElem = self->pFirst[--self->s32CurLen];
	if(self->s32CurLen == 0){
		//reallign pFirst with pAlloc when buffer becomes empty
		self->pFirst = self->ppAlloc;
	}
	return pElem;
}